

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O0

bool __thiscall
jsonnet::Jsonnet::evaluateSnippetMulti
          (Jsonnet *this,string *filename,string *snippet,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RCX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  char *in_RDI;
  char *jsonnet_output;
  int error;
  int local_2c [5];
  char *jsonnet_output_00;
  bool local_1;
  
  if (in_RCX == 0) {
    local_1 = false;
  }
  else {
    local_2c[0] = 0;
    uVar3 = *(undefined8 *)in_RDI;
    jsonnet_output_00 = in_RDI;
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = jsonnet_evaluate_snippet_multi(uVar3,uVar1,uVar2,local_2c);
    if (local_2c[0] == 0) {
      anon_unknown_1::parseMultiOutput(jsonnet_output_00,in_RSI);
      jsonnet_realloc(*(undefined8 *)in_RDI,uVar3,0);
      local_1 = true;
    }
    else {
      std::__cxx11::string::assign(in_RDI + 8);
      jsonnet_realloc(*(undefined8 *)in_RDI,uVar3,0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Jsonnet::evaluateSnippetMulti(const std::string& filename, const std::string& snippet,
                                   std::map<std::string, std::string>* outputs)
{
    if (outputs == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output =
        ::jsonnet_evaluate_snippet_multi(vm_, filename.c_str(), snippet.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    parseMultiOutput(jsonnet_output, outputs);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}